

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::Recycler::RescanMark(Recycler *this,DWORD waitTime)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  CollectionState CVar4;
  uint uVar5;
  ConfigFlagsTable *pCVar6;
  size_t sVar7;
  undefined8 *in_FS_OFFSET;
  AutoFilterExceptionRegion local_3c;
  BOOL local_38;
  AutoFilterExceptionRegion __autoFilterExceptionRegion_1;
  BOOL waited;
  AutoFilterExceptionRegion local_24;
  byte local_1d;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  bool onLowMemory;
  DWORD waitTime_local;
  Recycler *this_local;
  
  __autoFilterExceptionRegion.savedData.handledExceptionType = (Data)(Data)waitTime;
  local_1d = NeedOOMRescan(this);
  if (((this->inPartialCollectMode & 1U) == 0) && (bVar3 = DoQueueTrackedObject(this), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x966,"(this->inPartialCollectMode || DoQueueTrackedObject())",
                       "this->inPartialCollectMode || DoQueueTrackedObject()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_24,ExceptionType_All);
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[2])();
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_24);
  CVar4 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->collectionState);
  if (CVar4 != CollectionStateRescanFindRoots) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x973,"(collectionState == CollectionStateRescanFindRoots)",
                       "collectionState == CollectionStateRescanFindRoots");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((local_1d & 1) == 0) {
    pCVar6 = GetRecyclerFlagsTable(this);
    bVar3 = Js::Phases::IsEnabled(&pCVar6->Force,BackgroundFinishMarkPhase);
    if ((bVar3) ||
       (__autoFilterExceptionRegion.savedData.handledExceptionType != ~ExceptionType_None)) {
      bVar1 = this->backgroundFinishMarkCount;
      pCVar6 = GetRecyclerFlagsTable(this);
      uVar5 = RecyclerHeuristic::MaxBackgroundFinishMarkCount(pCVar6);
      if (bVar1 < uVar5) {
        PrepareBackgroundFindRoots(this);
        bVar3 = StartConcurrent(this,CollectionStateConcurrentFinishMark);
        if (bVar3) {
          this->backgroundFinishMarkCount = this->backgroundFinishMarkCount + '\x01';
          PrepareSweep(this);
          local_38 = WaitForConcurrentThread
                               (this,(DWORD)__autoFilterExceptionRegion.savedData.
                                            handledExceptionType,RescanMark);
          if (local_38 == 0) {
            pCVar6 = GetRecyclerFlagsTable(this);
            bVar3 = Js::Phases::IsEnabled(&pCVar6->Trace,BackgroundFinishMarkPhase);
            if (bVar3) {
              Output::Print(L"Finish mark timed out\n");
              Output::Flush();
            }
            AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_3c,ExceptionType_All);
            (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[4])();
            AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_3c);
            this_local = (Recycler *)&DAT_ffffffffffffffff;
            return (size_t)this_local;
          }
          CVar4 = ObservableValue::operator_cast_to_CollectionState
                            ((ObservableValue *)&this->collectionState);
          if (CVar4 != CollectionStateRescanWait) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                               ,0x98f,"(collectionState == CollectionStateRescanWait)",
                               "collectionState == CollectionStateRescanWait");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          SetCollectionState(this,CollectionStateRescanFindRoots);
          return this->backgroundRescanRootBytes;
        }
        RevertPrepareBackgroundFindRoots(this);
      }
    }
  }
  this->backgroundFinishMarkCount = '\0';
  sVar7 = FinishMarkRescan(this,false);
  return sVar7 << 0xc;
}

Assistant:

size_t
Recycler::RescanMark(DWORD waitTime)
{
    bool const onLowMemory = this->NeedOOMRescan();

    // REVIEW: Why are we asserting for DoQueueTrackedObject here?
    // Should we split this into different asserts depending on whether
    // concurrent or partial is enabled?
#if ENABLE_CONCURRENT_GC
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || DoQueueTrackedObject());
#else
    Assert(DoQueueTrackedObject());
#endif
#endif

    {
        // We are about to do a rescan mark, which for consistency requires the runtime to stop any additional mutator threads
        AUTO_NO_EXCEPTION_REGION;
        collectionWrapper->PreRescanMarkCallback();
    }

    // Always called in-thread
    Assert(collectionState == CollectionStateRescanFindRoots);
#if ENABLE_CONCURRENT_GC
    if (!onLowMemory && // Don't do background finish mark if we are low on memory
        // Only do background finish mark if we have a time limit or it is forced
        (CUSTOM_PHASE_FORCE1(GetRecyclerFlagsTable(), Js::BackgroundFinishMarkPhase) || waitTime != INFINITE) &&
        // Don't do background finish mark if we failed to finish mark too many times
        (this->backgroundFinishMarkCount < RecyclerHeuristic::MaxBackgroundFinishMarkCount(this->GetRecyclerFlagsTable())))
    {
        this->PrepareBackgroundFindRoots();
        if (StartConcurrent(CollectionStateConcurrentFinishMark))
        {
            this->backgroundFinishMarkCount++;
            this->PrepareSweep();
            GCETW(GC_RESCANMARKWAIT_START, (this, waitTime));
            const BOOL waited = WaitForConcurrentThread(waitTime, RecyclerWaitReason::RescanMark);
            GCETW(GC_RESCANMARKWAIT_STOP, (this, !waited));
            if (!waited)
            {
                CUSTOM_PHASE_PRINT_TRACE1(GetRecyclerFlagsTable(), Js::BackgroundFinishMarkPhase, _u("Finish mark timed out\n"));

                {
                    // We timed out doing the finish mark, notify the runtime
                    AUTO_NO_EXCEPTION_REGION;
                    collectionWrapper->RescanMarkTimeoutCallback();
                }

                return Recycler::InvalidScanRootBytes;
            }
            Assert(collectionState == CollectionStateRescanWait);
            this->SetCollectionState(CollectionStateRescanFindRoots);
#ifdef RECYCLER_WRITE_WATCH
            if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
            {
                Assert(autoHeap.GetWriteWatchPageCount() == 0);
            }
#endif
            return this->backgroundRescanRootBytes;
        }
        this->RevertPrepareBackgroundFindRoots();
    }
#endif
#if ENABLE_CONCURRENT_GC
    this->backgroundFinishMarkCount = 0;
#endif
    return FinishMarkRescan(false) * AutoSystemInfo::PageSize;
}